

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O0

ScriptBuilder * __thiscall cfd::core::ScriptBuilder::AppendData(ScriptBuilder *this,int64_t *data)

{
  pointer *this_00;
  iterator __first;
  iterator __last;
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> __result;
  ByteData local_a8;
  undefined1 local_90 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> byte_datas;
  ScriptElement element;
  int64_t *data_local;
  ScriptBuilder *this_local;
  
  this_00 = &byte_datas.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  ScriptElement::ScriptElement((ScriptElement *)this_00,*data);
  ScriptElement::GetData(&local_a8,(ScriptElement *)this_00);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_90,&local_a8);
  ByteData::~ByteData(&local_a8);
  __first = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_90);
  __last = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_90);
  __result = ::std::back_inserter<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       (&this->script_byte_array_);
  ::std::
  copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )__first._M_current,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )__last._M_current,__result);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_90);
  ScriptElement::~ScriptElement
            ((ScriptElement *)
             &byte_datas.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return this;
}

Assistant:

ScriptBuilder& ScriptBuilder::AppendData(const int64_t& data) {
  ScriptElement element(data);
  std::vector<uint8_t> byte_datas = element.GetData().GetBytes();
  std::copy(
      byte_datas.begin(), byte_datas.end(),
      std::back_inserter(script_byte_array_));
  return *this;
}